

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.cpp
# Opt level: O2

void __thiscall rsg::GeneratorState::~GeneratorState(GeneratorState *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_exprFlagStack).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  NameAllocator::~NameAllocator(&this->m_nameAllocator);
  return;
}

Assistant:

GeneratorState::~GeneratorState (void)
{
}